

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O0

void compact_array_suite::test_uint8(void)

{
  reference pvVar1;
  undefined4 local_f0 [2];
  undefined4 local_e8 [2];
  undefined4 local_e0 [2];
  undefined4 local_d8 [4];
  char *msg;
  array<unsigned_char,_4UL> local_b4;
  undefined1 local_b0 [4];
  array<unsigned_char,_4UL> value;
  iarchive in;
  value_type input [6];
  
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._4_2_ = 0x403;
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_ = 0x20104a8;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[6]>
            ((iarchive *)local_b0,
             (uchar (*) [6])
             ((long)&in.reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data + 0x48));
  local_b4._M_elems[0] = 0xff;
  local_b4._M_elems[1] = 0xff;
  local_b4._M_elems[2] = 0xff;
  local_b4._M_elems[3] = 0xff;
  boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
            ((interface_iarchive<trial::protocol::bintoken::iarchive> *)local_b0,&local_b4);
  pvVar1 = std::array<unsigned_char,_4UL>::operator[](&local_b4,0);
  local_d8[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("value[0]","UINT8_C(0x01)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x66,"void compact_array_suite::test_uint8()",pvVar1,local_d8);
  pvVar1 = std::array<unsigned_char,_4UL>::operator[](&local_b4,1);
  local_e0[0] = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("value[1]","UINT8_C(0x02)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x67,"void compact_array_suite::test_uint8()",pvVar1,local_e0);
  pvVar1 = std::array<unsigned_char,_4UL>::operator[](&local_b4,2);
  local_e8[0] = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("value[2]","UINT8_C(0x03)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x68,"void compact_array_suite::test_uint8()",pvVar1,local_e8);
  pvVar1 = std::array<unsigned_char,_4UL>::operator[](&local_b4,3);
  local_f0[0] = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("value[3]","UINT8_C(0x04)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x69,"void compact_array_suite::test_uint8()",pvVar1,local_f0);
  trial::protocol::bintoken::iarchive::~iarchive((iarchive *)local_b0);
  return;
}

Assistant:

void test_uint8()
{
    const value_type input[] = { token::code::array8_int8, 4 * token::int8::size,
                                 0x01,
                                 0x02,
                                 0x03,
                                 0x04 };
    format::iarchive in(input);
    std::array<std::uint8_t, 4> value = {{ std::numeric_limits<std::uint8_t>::max(),
                                           std::numeric_limits<std::uint8_t>::max(),
                                           std::numeric_limits<std::uint8_t>::max(),
                                           std::numeric_limits<std::uint8_t>::max() }};
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], UINT8_C(0x01));
    TRIAL_PROTOCOL_TEST_EQUAL(value[1], UINT8_C(0x02));
    TRIAL_PROTOCOL_TEST_EQUAL(value[2], UINT8_C(0x03));
    TRIAL_PROTOCOL_TEST_EQUAL(value[3], UINT8_C(0x04));
}